

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O3

void pugi::impl::anon_unknown_0::as_utf8_end(char *buffer,size_t size,wchar_t *str,size_t length)

{
  wchar_t ch;
  byte *result;
  size_t sVar1;
  
  result = (byte *)buffer;
  if (length != 0) {
    sVar1 = 0;
    do {
      ch = str[sVar1];
      if ((uint)ch < 0x10000) {
        result = utf8_writer::low(result,ch);
      }
      else {
        *result = (byte)((uint)ch >> 0x12) | 0xf0;
        result[1] = (byte)((uint)ch >> 0xc) & 0x3f | 0x80;
        result[2] = (byte)((uint)ch >> 6) & 0x3f | 0x80;
        result[3] = (byte)ch & 0x3f | 0x80;
        result = result + 4;
      }
      sVar1 = sVar1 + 1;
    } while (length != sVar1);
  }
  if ((byte *)(buffer + size) == result) {
    return;
  }
  __assert_fail("begin + size == end",
                "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/external/pugixml.cpp"
                ,0x912,
                "void pugi::impl::(anonymous namespace)::as_utf8_end(char *, size_t, const wchar_t *, size_t)"
               );
}

Assistant:

PUGI_IMPL_FN void as_utf8_end(char* buffer, size_t size, const wchar_t* str, size_t length)
	{
		// convert to utf8
		uint8_t* begin = reinterpret_cast<uint8_t*>(buffer);
		uint8_t* end = wchar_decoder::process(str, length, begin, utf8_writer());

		assert(begin + size == end);
		(void)!end;
		(void)!size;
	}